

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQTable::Mark(SQTable *this,SQCollectable **chain)

{
  SQTable *pSVar1;
  long lVar2;
  long local_28;
  SQInteger i;
  SQInteger len;
  SQCollectable **chain_local;
  SQTable *this_local;
  
  if (((this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef & 0x80000000) == 0) {
    (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef | 0x80000000;
    if ((this->super_SQDelegable)._delegate != (SQTable *)0x0) {
      pSVar1 = (this->super_SQDelegable)._delegate;
      (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[4])
                (pSVar1,chain);
    }
    lVar2 = this->_numofnodes;
    for (local_28 = 0; local_28 < lVar2; local_28 = local_28 + 1) {
      SQSharedState::MarkObject(&this->_nodes[local_28].key,(SQCollectable_conflict **)chain);
      SQSharedState::MarkObject(&this->_nodes[local_28].val,(SQCollectable_conflict **)chain);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
  }
  return;
}

Assistant:

void SQTable::Mark(SQCollectable **chain)
{
    START_MARK()
        if(_delegate) _delegate->Mark(chain);
        SQInteger len = _numofnodes;
        for(SQInteger i = 0; i < len; i++){
            SQSharedState::MarkObject(_nodes[i].key, chain);
            SQSharedState::MarkObject(_nodes[i].val, chain);
        }
    END_MARK()
}